

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIFactoredRewardDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
TOIFactoredRewardDecPOMDPDiscrete::TOIFactoredRewardDecPOMDPDiscrete
          (TOIFactoredRewardDecPOMDPDiscrete *this,string *name,string *descr,string *pf,
          bool cacheFlatModels)

{
  *(undefined ***)&this->field_0x2d8 = &PTR__POSGInterface_0060e508;
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)&this->field_0x2d8,&PTR_PTR_0060cdf0);
  *(undefined8 *)&this->field_0x2e0 = 0x60e6f0;
  *(undefined8 *)&this->field_0x2d8 = 0x60e8a0;
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            ((DecPOMDPDiscreteInterface *)&this->field_0x2d8,&PTR_construction_vtable_232__0060cdc8)
  ;
  TOIDecPOMDPDiscrete::TOIDecPOMDPDiscrete
            (&this->super_TOIDecPOMDPDiscrete,&PTR_construction_vtable_96__0060cd18,name,descr,pf,
             cacheFlatModels);
  *(undefined8 *)
   &(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
    super_MultiAgentDecisionProcess = 0x60c560;
  *(undefined8 *)&this->field_0x2d8 = 0x60c940;
  *(undefined8 *)&this->field_0x2e0 = 0x60cb98;
  *(undefined8 *)
   &(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.field_0x280
       = 0x60c7b8;
  *(undefined8 *)&this->field_0x2d0 = 0;
  *(undefined8 *)&(this->super_TOIDecPOMDPDiscrete).field_0x2c0 = 0;
  *(undefined8 *)&this->field_0x2c8 = 0;
  (this->super_TOIDecPOMDPDiscrete).field_0x2b8 = 0;
  return;
}

Assistant:

TOIFactoredRewardDecPOMDPDiscrete::
TOIFactoredRewardDecPOMDPDiscrete(
    const string &name, const string &descr, const string &pf,
    bool cacheFlatModels) :
    TOIDecPOMDPDiscrete(name, descr, pf, cacheFlatModels)
{
    _m_initialized = false;
}